

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocumentlayout.cpp
# Opt level: O2

QRectF * __thiscall
QTextDocumentLayoutPrivate::layoutFrame
          (QRectF *__return_storage_ptr__,QTextDocumentLayoutPrivate *this,QTextFrame *f,
          int layoutFrom,int layoutTo,QFixed frameWidth,QFixed frameHeight,QFixed parentY)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  Iterator it;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  QTextFrameData *pQVar8;
  QObject *object;
  QTextFrameData *pQVar9;
  QTextTable *pQVar10;
  QDebug *pQVar11;
  QTextFrame *pQVar12;
  int iVar13;
  QTextTableData *td;
  undefined1 *puVar14;
  int iVar15;
  QFixed QVar16;
  long in_FS_OFFSET;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  qreal qVar21;
  QSizeF QVar22;
  QArrayDataPointer<QTextFrame_*> local_108;
  undefined1 local_e8 [32];
  QTextLayoutStruct local_c8;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QtPrivateLogging::lcLayout();
  if (((byte)QtPrivateLogging::lcLayout::category.field_2.bools.enabledDebug._q_value._M_base._M_i &
      1) != 0) {
    local_c8.frame._0_4_ = 2;
    local_c8.frame._4_4_ = 0;
    local_c8.x_left.val = 0;
    local_c8.x_right.val = 0;
    local_c8.frameY.val = 0;
    local_c8.y.val = 0;
    local_c8.contentsWidth.val = (int)QtPrivateLogging::lcLayout::category.name;
    local_c8.minimumWidth.val = (int)((ulong)QtPrivateLogging::lcLayout::category.name >> 0x20);
    uVar5 = QTextFrame::firstPosition(f);
    uVar6 = QTextFrame::lastPosition(f);
    QTextFrame::parentFrame(f);
    QMessageLogger::debug
              ((char *)&local_c8,"layoutFrame (%d--%d), parent=%p",(ulong)uVar5,(ulong)uVar6);
  }
  pQVar8 = ::data(f);
  local_c8.frame._0_4_ = 0xaaaaaaaa;
  local_c8.frame._4_4_ = 0xaaaaaaaa;
  local_c8.x_left.val = -0x55555556;
  local_c8.x_right.val = -0x55555556;
  QTextFrame::frameFormat((QTextFrame *)&local_c8);
  qVar21 = QTextFrameFormat::topMargin((QTextFrameFormat *)&local_c8);
  qVar21 = scaleToDevice(this,qVar21);
  uVar5 = (int)(qVar21 * 64.0) + 0x20U & 0xffffffc0;
  bVar17 = uVar5 != (pQVar8->topMargin).val;
  if (bVar17) {
    (pQVar8->topMargin).val = uVar5;
  }
  qVar21 = QTextFrameFormat::bottomMargin((QTextFrameFormat *)&local_c8);
  qVar21 = scaleToDevice(this,qVar21);
  uVar5 = (int)(qVar21 * 64.0) + 0x20U & 0xffffffc0;
  bVar18 = uVar5 != (pQVar8->bottomMargin).val;
  if (bVar18) {
    (pQVar8->bottomMargin).val = uVar5;
  }
  qVar21 = QTextFrameFormat::leftMargin((QTextFrameFormat *)&local_c8);
  qVar21 = scaleToDevice(this,qVar21);
  (pQVar8->leftMargin).val = (int)(qVar21 * 64.0) + 0x20U & 0xffffffc0;
  qVar21 = QTextFrameFormat::rightMargin((QTextFrameFormat *)&local_c8);
  qVar21 = scaleToDevice(this,qVar21);
  (pQVar8->rightMargin).val = (int)(qVar21 * 64.0) + 0x20U & 0xffffffc0;
  qVar21 = QTextFrameFormat::border((QTextFrameFormat *)&local_c8);
  qVar21 = scaleToDevice(this,qVar21);
  uVar5 = (int)(qVar21 * 64.0) + 0x20U & 0xffffffc0;
  bVar19 = uVar5 != (pQVar8->border).val;
  if (bVar19) {
    (pQVar8->border).val = uVar5;
  }
  qVar21 = QTextFrameFormat::padding((QTextFrameFormat *)&local_c8);
  qVar21 = scaleToDevice(this,qVar21);
  uVar5 = (int)(qVar21 * 64.0) + 0x20U & 0xffffffc0;
  bVar20 = uVar5 != (pQVar8->padding).val;
  if (bVar20) {
    (pQVar8->padding).val = uVar5;
  }
  object = (QObject *)QTextFrame::parentFrame(f);
  if (object == (QObject *)0x0) {
    iVar7 = (pQVar8->padding).val + (pQVar8->border).val;
    uVar1 = pQVar8->topMargin;
    uVar2 = pQVar8->bottomMargin;
    pQVar8->effectiveTopMargin = (QFixed)(iVar7 + uVar1);
    pQVar8->effectiveBottomMargin = (QFixed)(iVar7 + uVar2);
  }
  else {
    pQVar9 = ::data((QTextFrame *)object);
    iVar7 = (pQVar8->border).val + (pQVar8->topMargin).val + (pQVar8->padding).val;
    (pQVar8->effectiveTopMargin).val = (pQVar9->effectiveTopMargin).val + iVar7;
    (pQVar8->effectiveBottomMargin).val = iVar7 + (pQVar9->effectiveBottomMargin).val;
    pQVar10 = QtPrivate::qobject_cast_helper<QTextTable*,QObject>(object);
    if (pQVar10 != (QTextTable *)0x0) {
      (pQVar8->effectiveTopMargin).val =
           (pQVar8->effectiveTopMargin).val +
           *(int *)&pQVar9[1].super_QTextFrameLayoutData._vptr_QTextFrameLayoutData +
           (pQVar9->border).val +
           *(int *)((long)&pQVar9[1].super_QTextFrameLayoutData._vptr_QTextFrameLayoutData + 4);
      (pQVar8->effectiveBottomMargin).val =
           (pQVar8->effectiveBottomMargin).val +
           *(int *)&pQVar9[1].super_QTextFrameLayoutData._vptr_QTextFrameLayoutData +
           (pQVar9->border).val +
           *(int *)((long)&pQVar9[1].super_QTextFrameLayoutData._vptr_QTextFrameLayoutData + 4);
    }
  }
  iVar7 = (pQVar8->leftMargin).val;
  iVar15 = (pQVar8->border).val + (pQVar8->padding).val;
  if (frameHeight.val == -0x40) {
    iVar13 = -0x40;
  }
  else {
    iVar13 = (iVar15 * -2 + frameHeight.val) -
             ((pQVar8->topMargin).val + (pQVar8->bottomMargin).val);
  }
  iVar3 = (pQVar8->rightMargin).val;
  (pQVar8->contentsHeight).val = iVar13;
  QTextFormat::~QTextFormat((QTextFormat *)&local_c8);
  bVar4 = isFrameFromInlineObject(f);
  if (bVar4) {
    __return_storage_ptr__->w = 0.0;
    __return_storage_ptr__->h = 0.0;
    __return_storage_ptr__->xp = 0.0;
    __return_storage_ptr__->yp = 0.0;
    goto LAB_004783d2;
  }
  iVar7 = (frameWidth.val + iVar15 * -2) - (iVar7 + iVar3);
  pQVar10 = QtPrivate::qobject_cast_helper<QTextTable*,QObject>((QObject *)f);
  (pQVar8->contentsWidth).val = iVar7;
  if (pQVar10 != (QTextTable *)0x0) {
    layoutTable(__return_storage_ptr__,this,pQVar10,layoutFrom,layoutTo,parentY);
    goto LAB_004783d2;
  }
  local_c8.pendingFloats.d.d = (Data *)0x0;
  local_c8.pendingFloats.d.ptr = (QTextFrame **)0x0;
  local_c8.pendingFloats.d.size = 0;
  local_c8.pageHeight.val = 0;
  local_c8.pageBottom.val = 0;
  local_c8.pageTopMargin.val = 0;
  local_c8.pageBottomMargin.val = 0;
  local_c8.updateRectForFloats.xp = 0.0;
  local_c8.updateRectForFloats.yp = 0.0;
  local_c8.updateRectForFloats.w = 0.0;
  local_c8.updateRectForFloats.h = 0.0;
  iVar15 = (pQVar8->padding).val + (pQVar8->border).val;
  QVar16.val = (pQVar8->leftMargin).val + iVar15;
  local_c8.y.val = iVar15 + (pQVar8->topMargin).val;
  local_c8.frameY.val = parentY.val + (pQVar8->position).y.val;
  local_c8.contentsWidth.val = 0;
  local_c8.minimumWidth.val = 0;
  local_c8.maximumWidth.val = 0x1fffffc0;
  bVar4 = true;
  if (!bVar20 && (!bVar19 && (!bVar18 && !bVar17))) {
    bVar4 = (pQVar8->oldContentsWidth).val != iVar7;
  }
  local_c8._37_3_ = 0xaaaaaa;
  local_c8.fullLayout = bVar4;
  local_c8.updateRect.xp = 0.0;
  local_c8.updateRect.yp = 0.0;
  local_c8.updateRect.w = 2147483647.0;
  local_c8.updateRect.h = 2147483647.0;
  local_c8.x_left.val = QVar16.val;
  local_c8.x_right.val = iVar7 + QVar16.val;
  local_c8.frame = f;
  QtPrivateLogging::lcLayout();
  if (((byte)QtPrivateLogging::lcLayout::category.field_2.bools.enabledDebug._q_value._M_base._M_i &
      1) != 0) {
    local_e8._0_4_ = 2;
    local_e8._4_4_ = 0;
    local_e8._8_4_ = 0;
    local_e8._12_4_ = 0;
    local_e8._16_4_ = 0;
    local_e8._20_4_ = 0;
    local_e8._24_8_ = QtPrivateLogging::lcLayout::category.name;
    QMessageLogger::debug();
    pQVar11 = QDebug::operator<<((QDebug *)&local_108,"layoutStruct: x_left");
    pQVar11 = ::operator<<(pQVar11,QVar16);
    pQVar11 = QDebug::operator<<(pQVar11,"x_right");
    pQVar11 = ::operator<<(pQVar11,(QFixed)(iVar7 + QVar16.val));
    pQVar11 = QDebug::operator<<(pQVar11,"fullLayout");
    QDebug::operator<<(pQVar11,bVar4);
    QDebug::~QDebug((QDebug *)&local_108);
  }
  (pQVar8->oldContentsWidth).val = iVar7;
  QVar22 = QTextDocument::pageSize((this->super_QAbstractTextDocumentLayoutPrivate).document);
  QVar16.val = (int)(QVar22.ht * 64.0);
  local_c8.pageHeight.val = QVar16.val;
  if (QVar16.val < 0) {
    local_c8.pageHeight.val = 0x1fffffc0;
    QVar16.val = 0x1fffffc0;
LAB_004781c9:
    QVar16 = QFixed::operator/(&local_c8.frameY,QVar16);
    iVar15 = ((QVar16.val >> 6) + 1) * local_c8.pageHeight.val;
  }
  else {
    if (QVar16.val != 0) goto LAB_004781c9;
    iVar15 = 0;
  }
  local_c8.pageTopMargin.val = (pQVar8->effectiveTopMargin).val;
  local_c8.pageBottomMargin.val = (pQVar8->effectiveBottomMargin).val;
  local_c8.pageBottom.val = iVar15 - (pQVar8->effectiveBottomMargin).val;
  pQVar12 = QTextFrame::parentFrame(f);
  if (pQVar12 == (QTextFrame *)0x0) {
    this->idealWidth = 0.0;
  }
  local_e8._16_4_ = 0xaaaaaaaa;
  local_e8._20_4_ = 0xaaaaaaaa;
  local_e8._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_e8._0_4_ = 0xaaaaaaaa;
  local_e8._4_4_ = 0xaaaaaaaa;
  local_e8._8_4_ = -0x55555556;
  local_e8._12_4_ = -0x55555556;
  QTextFrame::begin((iterator *)local_e8,f);
  it.f._4_4_ = local_e8._4_4_;
  it.f._0_4_ = local_e8._0_4_;
  it.e = local_e8._12_4_;
  it.b = local_e8._8_4_;
  it.cf._4_4_ = local_e8._20_4_;
  it.cf._0_4_ = local_e8._16_4_;
  it._24_8_ = local_e8._24_8_;
  layoutFlow(this,it,&local_c8,layoutFrom,layoutTo,(QFixed)0x0);
  local_108.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_108.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_108.ptr = (QTextFrame **)&DAT_aaaaaaaaaaaaaaaa;
  QTextFrame::childFrames((QList<QTextFrame_*> *)&local_108,f);
  iVar15 = 0;
  for (puVar14 = (undefined1 *)0x0; puVar14 < (ulong)local_108.size; puVar14 = puVar14 + 1) {
    pQVar9 = ::data(local_108.ptr[(long)puVar14]);
    iVar13 = (pQVar9->size).width.val;
    if (iVar15 <= iVar13) {
      iVar15 = iVar13;
    }
  }
  iVar13 = ((pQVar8->border).val + (pQVar8->padding).val) * 2 + (pQVar8->leftMargin).val +
           (pQVar8->rightMargin).val;
  pQVar12 = QTextFrame::parentFrame(f);
  QVar16.val = local_c8.contentsWidth.val;
  if (local_c8.contentsWidth.val < iVar15) {
    QVar16.val = iVar15;
  }
  if (pQVar12 == (QTextFrame *)0x0) {
    this->idealWidth = (double)iVar13 * 0.015625 + (double)QVar16.val * 0.015625;
  }
  if (QVar16.val < iVar7) {
    QVar16.val = iVar7;
  }
  if (0 < iVar7) {
    iVar7 = QVar16.val;
  }
  (pQVar8->contentsWidth).val = iVar7;
  pQVar8->minimumWidth = (QFixed)local_c8.minimumWidth.val;
  pQVar8->maximumWidth = (QFixed)local_c8.maximumWidth.val;
  iVar7 = (pQVar8->contentsHeight).val;
  if (iVar7 == -0x40) {
    iVar7 = local_c8.y.val + (pQVar8->border).val + (pQVar8->padding).val;
  }
  else {
    iVar7 = iVar7 + (pQVar8->topMargin).val + ((pQVar8->border).val + (pQVar8->padding).val) * 2;
  }
  (pQVar8->size).height.val = iVar7 + (pQVar8->bottomMargin).val;
  (pQVar8->size).width.val = QVar16.val + iVar13;
  pQVar8->sizeDirty = false;
  if ((0.0 < local_c8.updateRectForFloats.w) && (0.0 < local_c8.updateRectForFloats.h)) {
    QRectF::operator|=(&local_c8.updateRect,&local_c8.updateRectForFloats);
  }
  __return_storage_ptr__->w = local_c8.updateRect.w;
  __return_storage_ptr__->h = local_c8.updateRect.h;
  __return_storage_ptr__->xp = local_c8.updateRect.xp;
  __return_storage_ptr__->yp = local_c8.updateRect.yp;
  QArrayDataPointer<QTextFrame_*>::~QArrayDataPointer(&local_108);
  QArrayDataPointer<QTextFrame_*>::~QArrayDataPointer(&local_c8.pendingFloats.d);
LAB_004783d2:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QRectF QTextDocumentLayoutPrivate::layoutFrame(QTextFrame *f, int layoutFrom, int layoutTo, QFixed frameWidth, QFixed frameHeight, QFixed parentY)
{
    qCDebug(lcLayout, "layoutFrame (%d--%d), parent=%p", f->firstPosition(), f->lastPosition(), f->parentFrame());
    Q_ASSERT(data(f)->sizeDirty);

    QTextFrameData *fd = data(f);
    QFixed newContentsWidth;

    bool fullLayout = false;
    {
        QTextFrameFormat fformat = f->frameFormat();
        // set sizes of this frame from the format
        QFixed tm = QFixed::fromReal(scaleToDevice(fformat.topMargin())).round();
        if (tm != fd->topMargin) {
            fd->topMargin = tm;
            fullLayout = true;
        }
        QFixed bm = QFixed::fromReal(scaleToDevice(fformat.bottomMargin())).round();
        if (bm != fd->bottomMargin) {
            fd->bottomMargin = bm;
            fullLayout = true;
        }
        fd->leftMargin = QFixed::fromReal(scaleToDevice(fformat.leftMargin())).round();
        fd->rightMargin = QFixed::fromReal(scaleToDevice(fformat.rightMargin())).round();
        QFixed b = QFixed::fromReal(scaleToDevice(fformat.border())).round();
        if (b != fd->border) {
            fd->border = b;
            fullLayout = true;
        }
        QFixed p = QFixed::fromReal(scaleToDevice(fformat.padding())).round();
        if (p != fd->padding) {
            fd->padding = p;
            fullLayout = true;
        }

        QTextFrame *parent = f->parentFrame();
        const QTextFrameData *pd = parent ? data(parent) : nullptr;

        // accumulate top and bottom margins
        if (parent) {
            fd->effectiveTopMargin = pd->effectiveTopMargin + fd->topMargin + fd->border + fd->padding;
            fd->effectiveBottomMargin = pd->effectiveBottomMargin + fd->topMargin + fd->border + fd->padding;

            if (qobject_cast<QTextTable *>(parent)) {
                const QTextTableData *td = static_cast<const QTextTableData *>(pd);
                fd->effectiveTopMargin += td->cellSpacing + td->border + td->cellPadding;
                fd->effectiveBottomMargin += td->cellSpacing + td->border + td->cellPadding;
            }
        } else {
            fd->effectiveTopMargin = fd->topMargin + fd->border + fd->padding;
            fd->effectiveBottomMargin = fd->bottomMargin + fd->border + fd->padding;
        }

        newContentsWidth = frameWidth - 2*(fd->border + fd->padding)
                           - fd->leftMargin - fd->rightMargin;

        if (frameHeight != -1) {
            fd->contentsHeight = frameHeight - 2*(fd->border + fd->padding)
                                 - fd->topMargin - fd->bottomMargin;
        } else {
            fd->contentsHeight = frameHeight;
        }
    }

    if (isFrameFromInlineObject(f)) {
        // never reached, handled in resizeInlineObject/positionFloat instead
        return QRectF();
    }

    if (QTextTable *table = qobject_cast<QTextTable *>(f)) {
        fd->contentsWidth = newContentsWidth;
        return layoutTable(table, layoutFrom, layoutTo, parentY);
    }

    // set fd->contentsWidth temporarily, so that layoutFrame for the children
    // picks the right width. We'll initialize it properly at the end of this
    // function.
    fd->contentsWidth = newContentsWidth;

    QTextLayoutStruct layoutStruct;
    layoutStruct.frame = f;
    layoutStruct.x_left = fd->leftMargin + fd->border + fd->padding;
    layoutStruct.x_right = layoutStruct.x_left + newContentsWidth;
    layoutStruct.y = fd->topMargin + fd->border + fd->padding;
    layoutStruct.frameY = parentY + fd->position.y;
    layoutStruct.contentsWidth = 0;
    layoutStruct.minimumWidth = 0;
    layoutStruct.maximumWidth = QFIXED_MAX;
    layoutStruct.fullLayout = fullLayout || (fd->oldContentsWidth != newContentsWidth);
    layoutStruct.updateRect = QRectF(QPointF(0, 0), QSizeF(qreal(INT_MAX), qreal(INT_MAX)));
    qCDebug(lcLayout) << "layoutStruct: x_left" << layoutStruct.x_left << "x_right" << layoutStruct.x_right
                      << "fullLayout" << layoutStruct.fullLayout;
    fd->oldContentsWidth = newContentsWidth;

    layoutStruct.pageHeight = QFixed::fromReal(document->pageSize().height());
    if (layoutStruct.pageHeight < 0)
        layoutStruct.pageHeight = QFIXED_MAX;

    const int currentPage = layoutStruct.pageHeight == 0 ? 0 : (layoutStruct.frameY / layoutStruct.pageHeight).truncate();
    layoutStruct.pageTopMargin = fd->effectiveTopMargin;
    layoutStruct.pageBottomMargin = fd->effectiveBottomMargin;
    layoutStruct.pageBottom = (currentPage + 1) * layoutStruct.pageHeight - layoutStruct.pageBottomMargin;

    if (!f->parentFrame())
        idealWidth = 0; // reset

    QTextFrame::Iterator it = f->begin();
    layoutFlow(it, &layoutStruct, layoutFrom, layoutTo);

    QFixed maxChildFrameWidth = 0;
    QList<QTextFrame *> children = f->childFrames();
    for (int i = 0; i < children.size(); ++i) {
        QTextFrame *c = children.at(i);
        QTextFrameData *cd = data(c);
        maxChildFrameWidth = qMax(maxChildFrameWidth, cd->size.width);
    }

    const QFixed marginWidth = 2*(fd->border + fd->padding) + fd->leftMargin + fd->rightMargin;
    if (!f->parentFrame()) {
        idealWidth = qMax(maxChildFrameWidth, layoutStruct.contentsWidth).toReal();
        idealWidth += marginWidth.toReal();
    }

    QFixed actualWidth = qMax(newContentsWidth, qMax(maxChildFrameWidth, layoutStruct.contentsWidth));
    fd->contentsWidth = actualWidth;
    if (newContentsWidth <= 0) { // nowrap layout?
        fd->contentsWidth = newContentsWidth;
    }

    fd->minimumWidth = layoutStruct.minimumWidth;
    fd->maximumWidth = layoutStruct.maximumWidth;

    fd->size.height = fd->contentsHeight == -1
                 ? layoutStruct.y + fd->border + fd->padding + fd->bottomMargin
                 : fd->contentsHeight + 2*(fd->border + fd->padding) + fd->topMargin + fd->bottomMargin;
    fd->size.width = actualWidth + marginWidth;
    fd->sizeDirty = false;
    if (layoutStruct.updateRectForFloats.isValid())
        layoutStruct.updateRect |= layoutStruct.updateRectForFloats;
    return layoutStruct.updateRect;
}